

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::writeLinearized(QPDFWriter *this)

{
  undefined *puVar1;
  bool bVar2;
  int objid;
  int hint_id;
  int size;
  element_type *peVar3;
  pointer pQVar4;
  Count *pCVar5;
  size_type sVar6;
  __single_object _Var7;
  uint uVar8;
  uint max_id;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  QPDFObjGen QVar13;
  Pl_StdioFile *this_00;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar14;
  Object *pOVar15;
  NewObject *pNVar16;
  string *psVar17;
  qpdf_offset_t hint_offset;
  size_type *psVar18;
  long *plVar19;
  logic_error *plVar20;
  runtime_error *this_01;
  int iVar21;
  uint max_id_00;
  string *idx;
  string *psVar22;
  string *psVar23;
  size_t __n;
  ulong uVar25;
  int xref_id;
  string *psVar26;
  ulong uVar27;
  int i;
  uint uVar28;
  long lVar29;
  size_type sVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  int iVar34;
  QPDFObjectHandle *oh;
  pointer pQVar35;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link;
  QPDFObjectHandle *this_02;
  long lVar36;
  undefined *nspaces;
  uint uVar37;
  QPDFObjectHandle *oh_1;
  size_t sVar38;
  bool bVar39;
  string __str;
  string *local_2d0;
  FILE *local_2c8;
  qpdf_offset_t local_2a8;
  size_type local_2a0;
  __single_object pp_pass1;
  __single_object pp_md5;
  int local_280;
  string *local_278;
  size_type local_270;
  size_type local_268;
  size_type local_250;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_238;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_230;
  string hint_buffer;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part4;
  QPDFObjectHandle local_1e8;
  QPDFObjectHandle local_1d8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part6;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part9;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part7;
  int local_140 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *vecs1 [2];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *vecs2 [3];
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> stream_cache;
  long lVar24;
  
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &stream_cache._M_t._M_impl.super__Rb_tree_header._M_header;
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8._8_8_ = &stream_cache;
  pcStack_d0 = std::
               _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc:2580:35)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc:2580:35)>
             ::_M_manager;
  local_e8._M_unused._M_object = this;
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDF::Writer::optimize(peVar3->pdf,&peVar3->obj,(function<int_(QPDFObjectHandle_&)> *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDF::getLinearizedParts(peVar3->pdf,&peVar3->obj,&part4,&part6,&part7,&part8,&part9);
  uVar33 = ((long)part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4) +
           ((long)part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4) +
           ((long)part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4);
  if ((uVar33 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar33);
  }
  iVar21 = (int)uVar33 + 1;
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3->next_objid = iVar21;
  bVar2 = (peVar3->obj).streams_empty;
  local_280 = 0;
  if (bVar2 == false) {
    peVar3->next_objid = (int)uVar33 + 2;
    local_280 = iVar21;
  }
  vecs2[0] = &part7;
  vecs2[1] = &part8;
  vecs2[2] = &part9;
  lVar29 = 0;
  do {
    pQVar4 = (vecs2[lVar29]->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar35 = (vecs2[lVar29]->
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
                   super__Vector_impl_data._M_start; pQVar35 != pQVar4; pQVar35 = pQVar35 + 1) {
      QVar13 = QPDFObjectHandle::getObjGen(pQVar35);
      assignCompressedObjectNumbers(this,QVar13);
    }
    lVar29 = lVar29 + 1;
  } while (lVar29 != 3);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  objid = peVar3->next_objid;
  iVar11 = objid + 2;
  if (bVar2 != false) {
    iVar11 = objid + 1;
  }
  xref_id = 0;
  if (bVar2 == false) {
    xref_id = objid + 1;
  }
  peVar3->next_objid = iVar11;
  uVar33 = (long)part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  if (0x7fffffff < uVar33) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar33);
  }
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar31 = (int)uVar33 + peVar3->next_objid;
  peVar3->next_objid = iVar31;
  if (peVar3->encrypted == true) {
    peVar3->next_objid = iVar31 + 1;
    peVar3->encryption_dict_objid = iVar31;
  }
  hint_id = peVar3->next_objid;
  idx = (string *)(long)hint_id;
  peVar3->next_objid = hint_id + 1;
  uVar33 = (long)part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  if ((uVar33 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar33);
  }
  max_id = objid - 1;
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar34 = (int)uVar33 + peVar3->next_objid;
  peVar3->next_objid = iVar34;
  vecs1[0] = &part4;
  vecs1[1] = &part6;
  lVar29 = 0;
  do {
    pQVar4 = (vecs1[lVar29]->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar35 = (vecs1[lVar29]->
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
                   super__Vector_impl_data._M_start; pQVar35 != pQVar4; pQVar35 = pQVar35 + 1) {
      QVar13 = QPDFObjectHandle::getObjGen(pQVar35);
      assignCompressedObjectNumbers(this,QVar13);
    }
    bVar39 = lVar29 == 0;
    lVar29 = lVar29 + 1;
  } while (bVar39);
  size = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         next_objid;
  iVar9 = QPDFObjectHandle::getObjectID
                    (part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1);
  iVar10 = QPDFObjectHandle::getObjectID
                     (part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish + -1);
  ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_objid
       = iVar11;
  enqueuePart(this,&part4);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->next_objid == iVar31) {
    peVar3->next_objid = hint_id + 1;
    enqueuePart(this,&part6);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3->next_objid == iVar34) {
      peVar3->next_objid = 1;
      enqueuePart(this,&part7);
      enqueuePart(this,&part8);
      enqueuePart(this,&part9);
      if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          next_objid == iVar21) {
        hint_buffer._M_dataplus._M_p = (pointer)&hint_buffer.field_2;
        hint_buffer._M_string_length = 0;
        hint_buffer.field_2._M_local_buf[0] = '\0';
        pp_pass1._M_t.
        super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
        ._M_t.
        super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
        .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
             (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
              )operator_new(0x10);
        *(QPDFWriter **)
         pp_pass1._M_t.
         super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
         ._M_t.
         super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
         .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl = this;
        *(undefined8 *)
         ((long)pp_pass1._M_t.
                super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                ._M_t.
                super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl + 8) = 0;
        pp_md5._M_t.
        super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
        ._M_t.
        super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
        .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
             (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
              )operator_new(0x10);
        max_id_00 = size - 1;
        *(QPDFWriter **)
         pp_md5._M_t.
         super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
         ._M_t.
         super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
         .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl = this;
        *(undefined8 *)
         ((long)pp_md5._M_t.
                super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                ._M_t.
                super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl + 8) = 0;
        local_140[0] = 1;
        local_140[1] = 2;
        local_2a8 = 0;
        local_250 = 0;
        local_268 = 0;
        local_2a0 = 0;
        sVar30 = 0;
        local_278 = (string *)0x0;
        local_270 = 0;
        local_2d0 = (string *)0x0;
        local_2c8 = (FILE *)0x0;
        lVar29 = 0;
        do {
          iVar21 = *(int *)((long)local_140 + lVar29);
          if (iVar21 == 1) {
            peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((peVar3->lin_pass1_filename)._M_string_length == 0) {
              local_238._M_t.
              super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
              super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
                   (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
                   (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
              link = &local_238;
              activatePipelineStack
                        (this,(PipelinePopper *)
                              pp_pass1._M_t.
                              super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                              .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                              _M_head_impl,true,(string *)0x0,
                         (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)link);
            }
            else {
              local_2c8 = (FILE *)QUtil::safe_fopen((peVar3->lin_pass1_filename)._M_dataplus._M_p,
                                                    "wb");
              this_00 = (Pl_StdioFile *)operator_new(0x38);
              Pl_StdioFile::Pl_StdioFile(this_00,"linearization pass1",(FILE *)local_2c8);
              pushPipeline(this,(Pipeline *)this_00);
              local_230._M_t.
              super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
              super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
                   (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
                   (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
              link = &local_230;
              activatePipelineStack
                        (this,(PipelinePopper *)
                              pp_pass1._M_t.
                              super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                              .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                              _M_head_impl,false,(string *)0x0,
                         (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)link);
            }
            std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                      ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)link);
            if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->deterministic_id == true) {
              pushMD5Pipeline(this,(PipelinePopper *)
                                   pp_md5._M_t.
                                   super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                   .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                                   _M_head_impl);
            }
          }
          writeHeader(this);
          pCVar5 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pipeline;
          psVar22 = pCVar5->str;
          psVar18 = (size_type *)&pCVar5->count;
          if (psVar22 != (string *)0x0) {
            psVar18 = &psVar22->_M_string_length;
          }
          sVar6 = *psVar18;
          openObject(this,objid);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x286d1a,(void *)0x2,(size_t)psVar22);
          if (iVar21 == 2) {
            pvVar14 = QPDF::getAllPages(((this->m).
                                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->pdf);
            pQVar35 = (pvVar14->
                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if ((pvVar14->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                _M_impl.super__Vector_impl_data._M_finish == pQVar35) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
            }
            peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_1d8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pQVar35->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_1d8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (pQVar35->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_1d8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1d8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_1d8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1d8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_1d8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            iVar11 = QPDFObjectHandle::getObjectID(&local_1d8);
            uVar27 = (ulong)iVar11;
            lVar24 = *(long *)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                               super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                               .
                               super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                               ._M_impl;
            uVar33 = ((long)*(pointer *)
                             ((long)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                                     super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                     .
                                     super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                             + 8) - lVar24 >> 2) * -0x5555555555555555;
            if (uVar33 < uVar27 || uVar33 - uVar27 == 0) {
              pOVar15 = ObjTable<QPDFWriter::Object>::large_element
                                  (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,uVar27);
            }
            else {
              uVar33 = uVar27 * 3;
              pOVar15 = (Object *)(lVar24 + uVar27 * 0xc);
            }
            uVar28 = pOVar15->renumber;
            if (local_1d8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1d8.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            uVar27 = (long)(pvVar14->
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar14->
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 4;
            if ((uVar27 & 0xffffffff80000000) != 0) {
              QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar27);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x287264,(void *)0x12,uVar33);
            psVar22 = (string *)((long)&(local_2d0->_M_dataplus)._M_p + local_250);
            psVar23 = (string *)-(long)psVar22;
            if (0 < (long)psVar22) {
              psVar23 = psVar22;
            }
            uVar32 = 1;
            psVar17 = local_2d0;
            if ((string *)0x9 < psVar23) {
              psVar17 = psVar23;
              uVar37 = 4;
              do {
                uVar32 = uVar37;
                if (psVar17 < (string *)0x64) {
                  uVar32 = uVar32 - 2;
                  goto LAB_001fad18;
                }
                if (psVar17 < (string *)0x3e8) {
                  uVar32 = uVar32 - 1;
                  goto LAB_001fad18;
                }
                if (psVar17 < (string *)0x2710) goto LAB_001fad18;
                psVar26 = (string *)((ulong)psVar17 / 10000);
                bVar39 = (string *)0x1869f < psVar17;
                psVar17 = psVar26;
                uVar37 = uVar32 + 4;
              } while (bVar39);
              uVar32 = uVar32 + 1;
            }
LAB_001fad18:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar32 - (char)((long)psVar22 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)psVar22 >> 0x3f),uVar32,
                       (unsigned_long_long)psVar23);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar17);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x287277,(void *)0x6,(size_t)psVar17);
            peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            lVar24 = *(long *)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                               super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               .
                               super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               ._M_impl;
            psVar22 = (string *)
                      ((long)*(pointer *)
                              ((long)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                      super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                      .
                                      super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                              + 8) - lVar24 >> 5);
            if (idx < psVar22) {
              pNVar16 = (NewObject *)(lVar24 + (long)idx * 0x20);
            }
            else {
              pNVar16 = ObjTable<QPDFWriter::NewObject>::large_element
                                  (&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                   (size_t)idx);
            }
            psVar17 = (string *)QPDFXRefEntry::getOffset(&pNVar16->xref);
            psVar23 = (string *)-(long)psVar17;
            if (0 < (long)psVar17) {
              psVar23 = psVar17;
            }
            uVar32 = 1;
            if ((string *)0x9 < psVar23) {
              psVar22 = psVar23;
              uVar37 = 4;
              do {
                uVar32 = uVar37;
                if (psVar22 < (string *)0x64) {
                  uVar32 = uVar32 - 2;
                  goto LAB_001fae45;
                }
                if (psVar22 < (string *)0x3e8) {
                  uVar32 = uVar32 - 1;
                  goto LAB_001fae45;
                }
                if (psVar22 < (string *)0x2710) goto LAB_001fae45;
                psVar26 = (string *)((ulong)psVar22 / 10000);
                bVar39 = (string *)0x1869f < psVar22;
                psVar22 = psVar26;
                uVar37 = uVar32 + 4;
              } while (bVar39);
              uVar32 = uVar32 + 1;
            }
LAB_001fae45:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar32 - (char)((long)psVar17 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)psVar17 >> 0x3f),uVar32,
                       (unsigned_long_long)psVar23);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar22);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x286f7c,(void *)0x1,(size_t)psVar22);
            psVar23 = (string *)-(long)local_2d0;
            if (0 < (long)local_2d0) {
              psVar23 = local_2d0;
            }
            uVar32 = 1;
            if ((string *)0x9 < psVar23) {
              psVar22 = psVar23;
              uVar37 = 4;
              do {
                uVar32 = uVar37;
                if (psVar22 < (string *)0x64) {
                  uVar32 = uVar32 - 2;
                  goto LAB_001faf32;
                }
                if (psVar22 < (string *)0x3e8) {
                  uVar32 = uVar32 - 1;
                  goto LAB_001faf32;
                }
                if (psVar22 < (string *)0x2710) goto LAB_001faf32;
                psVar17 = (string *)((ulong)psVar22 / 10000);
                bVar39 = (string *)0x1869f < psVar22;
                psVar22 = psVar17;
                uVar37 = uVar32 + 4;
              } while (bVar39);
              uVar32 = uVar32 + 1;
            }
LAB_001faf32:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar32 - (char)((long)local_2d0 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)local_2d0 >> 0x3f),uVar32,
                       (unsigned_long_long)psVar23);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar22);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x28727e,(void *)0x6,(size_t)psVar22);
            uVar32 = -uVar28;
            if (0 < (int)uVar28) {
              uVar32 = uVar28;
            }
            uVar37 = 1;
            if (9 < uVar32) {
              psVar23 = (string *)(ulong)uVar32;
              uVar8 = 4;
              do {
                uVar37 = uVar8;
                uVar12 = (uint)psVar23;
                if (uVar12 < 100) {
                  uVar37 = uVar37 - 2;
                  goto LAB_001fb017;
                }
                if (uVar12 < 1000) {
                  uVar37 = uVar37 - 1;
                  goto LAB_001fb017;
                }
                if (uVar12 < 10000) goto LAB_001fb017;
                psVar23 = (string *)((ulong)psVar23 / 10000);
                psVar22 = psVar23;
                uVar8 = uVar37 + 4;
              } while (99999 < uVar12);
              uVar37 = uVar37 + 1;
            }
LAB_001fb017:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar37 - (char)((int)uVar28 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (__str._M_dataplus._M_p + (uVar28 >> 0x1f),uVar37,uVar32);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar22);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x287285,(void *)0x4,(size_t)psVar22);
            psVar23 = (string *)((long)&(local_2d0->_M_dataplus)._M_p + local_268);
            psVar17 = (string *)-(long)psVar23;
            if (0 < (long)psVar23) {
              psVar17 = psVar23;
            }
            uVar28 = 1;
            psVar22 = local_2d0;
            if ((string *)0x9 < psVar17) {
              psVar22 = psVar17;
              uVar32 = 4;
              do {
                uVar28 = uVar32;
                if (psVar22 < (string *)0x64) {
                  uVar28 = uVar28 - 2;
                  goto LAB_001fb110;
                }
                if (psVar22 < (string *)0x3e8) {
                  uVar28 = uVar28 - 1;
                  goto LAB_001fb110;
                }
                if (psVar22 < (string *)0x2710) goto LAB_001fb110;
                psVar26 = (string *)((ulong)psVar22 / 10000);
                bVar39 = (string *)0x1869f < psVar22;
                psVar22 = psVar26;
                uVar32 = uVar28 + 4;
              } while (bVar39);
              uVar28 = uVar28 + 1;
            }
LAB_001fb110:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar28 - (char)((long)psVar23 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)psVar23 >> 0x3f),uVar28,
                       (unsigned_long_long)psVar17);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar22);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x286fa3,(void *)0x4,(size_t)psVar22);
            uVar32 = (uint)uVar27;
            uVar28 = -uVar32;
            if (0 < (int)uVar32) {
              uVar28 = uVar32;
            }
            uVar37 = 1;
            if (9 < uVar28) {
              psVar23 = (string *)(ulong)uVar28;
              uVar8 = 4;
              do {
                uVar37 = uVar8;
                uVar12 = (uint)psVar23;
                if (uVar12 < 100) {
                  uVar37 = uVar37 - 2;
                  goto LAB_001fb1f3;
                }
                if (uVar12 < 1000) {
                  uVar37 = uVar37 - 1;
                  goto LAB_001fb1f3;
                }
                if (uVar12 < 10000) goto LAB_001fb1f3;
                psVar23 = (string *)((ulong)psVar23 / 10000);
                psVar22 = psVar23;
                uVar8 = uVar37 + 4;
              } while (99999 < uVar12);
              uVar37 = uVar37 + 1;
            }
LAB_001fb1f3:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar37 - ((char)(uVar27 >> 0x18) >> 7));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (__str._M_dataplus._M_p + (uVar32 >> 0x1f),uVar37,uVar28);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar22);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x28728a,(void *)0x4,(size_t)psVar22);
            psVar17 = (string *)((long)&(local_2d0->_M_dataplus)._M_p + local_2a8);
            psVar23 = (string *)-(long)psVar17;
            if (0 < (long)psVar17) {
              psVar23 = psVar17;
            }
            uVar28 = 1;
            if ((string *)0x9 < psVar23) {
              psVar22 = psVar23;
              uVar32 = 4;
              do {
                uVar28 = uVar32;
                if (psVar22 < (string *)0x64) {
                  uVar28 = uVar28 - 2;
                  goto LAB_001fb2e2;
                }
                if (psVar22 < (string *)0x3e8) {
                  uVar28 = uVar28 - 1;
                  goto LAB_001fb2e2;
                }
                if (psVar22 < (string *)0x2710) goto LAB_001fb2e2;
                psVar26 = (string *)((ulong)psVar22 / 10000);
                bVar39 = (string *)0x1869f < psVar22;
                psVar22 = psVar26;
                uVar32 = uVar28 + 4;
              } while (bVar39);
              uVar28 = uVar28 + 1;
            }
LAB_001fb2e2:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar28 - (char)((long)psVar17 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)psVar17 >> 0x3f),uVar28,
                       (unsigned_long_long)psVar23);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar22);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
          }
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x28717c,(void *)0x3,(size_t)psVar22);
          closeObject(this,objid);
          pCVar5 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pipeline;
          psVar22 = pCVar5->str;
          psVar18 = (size_type *)&pCVar5->count;
          if (psVar22 != (string *)0x0) {
            psVar18 = &psVar22->_M_string_length;
          }
          sVar38 = (sVar6 - *psVar18) + 200;
          if ((long)(sVar6 - *psVar18) < -200) {
            QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar38);
          }
          writePad(this,sVar38);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x2870dd,(void *)0x1,(size_t)psVar22);
          peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          ::qpdf::pl::Count::write
                    (peVar3->pipeline,(int)(peVar3->extra_header_text)._M_dataplus._M_p,
                     (void *)(peVar3->extra_header_text)._M_string_length,(size_t)psVar22);
          peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          psVar22 = peVar3->pipeline->str;
          psVar18 = (size_type *)&peVar3->pipeline->count;
          if (psVar22 != (string *)0x0) {
            psVar18 = &psVar22->_M_string_length;
          }
          psVar22 = (string *)*psVar18;
          if (iVar21 == 2) {
            lVar24 = *(long *)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                               super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               .
                               super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               ._M_impl;
            if (idx < (string *)
                      ((long)*(pointer *)
                              ((long)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                      super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                      .
                                      super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                              + 8) - lVar24 >> 5)) {
              pNVar16 = (NewObject *)(lVar24 + (long)idx * 0x20);
            }
            else {
              pNVar16 = ObjTable<QPDFWriter::NewObject>::large_element
                                  (&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                   (size_t)idx);
            }
            hint_offset = QPDFXRefEntry::getOffset(&pNVar16->xref);
          }
          else {
            hint_offset = 0;
          }
          if (bVar2 == false) {
            if (iVar21 == 1) {
              local_2a0 = 0x2000000;
            }
            pCVar5 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline;
            psVar23 = pCVar5->str;
            psVar18 = (size_type *)&pCVar5->count;
            if (psVar23 != (string *)0x0) {
              psVar18 = &psVar23->_M_string_length;
            }
            sVar6 = *psVar18;
            writeXRefStream(this,xref_id,max_id_00,local_2a0,t_lin_first,objid,max_id_00,size,
                            (qpdf_offset_t)((long)&(local_2d0->_M_dataplus)._M_p + sVar30),hint_id,
                            hint_offset,(qpdf_offset_t)local_2d0,iVar21 == 1,iVar21);
            pCVar5 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline;
            psVar23 = pCVar5->str;
            psVar18 = (size_type *)&pCVar5->count;
            if (psVar23 != (string *)0x0) {
              psVar18 = &psVar23->_M_string_length;
            }
            sVar30 = *psVar18;
            if (iVar21 == 1) {
              lVar36 = sVar30 - sVar6;
              lVar24 = lVar36 + 0x7ffe;
              if (-1 < lVar36 + 0x3fff) {
                lVar24 = lVar36 + 0x3fff;
              }
              sVar38 = (lVar24 >> 0xe) * 5 + 0x10;
              if (lVar36 < -0x13ffe) {
                QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar38);
              }
              writePad(this,sVar38);
              pCVar5 = ((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline;
              psVar23 = pCVar5->str;
              psVar18 = (size_type *)&pCVar5->count;
              if (psVar23 != (string *)0x0) {
                psVar18 = &psVar23->_M_string_length;
              }
              local_278 = (string *)*psVar18;
            }
            else {
              sVar38 = (long)local_278 - sVar30;
              if ((long)sVar38 < 0) {
                QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar38);
              }
              writePad(this,sVar38);
              pCVar5 = ((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline;
              psVar23 = pCVar5->str;
              psVar18 = (size_type *)&pCVar5->count;
              if (psVar23 != (string *)0x0) {
                psVar18 = &psVar23->_M_string_length;
              }
              psVar23 = local_278;
              if ((string *)*psVar18 != local_278) {
                plVar20 = (logic_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_a0,(longlong)local_278);
                std::operator+(&local_80,
                               "insufficient padding for first pass xref stream; first_xref_end=",
                               &local_a0);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_80);
                local_138._M_dataplus._M_p = (pointer)*plVar19;
                psVar18 = (size_type *)(plVar19 + 2);
                if ((size_type *)local_138._M_dataplus._M_p == psVar18) {
                  local_138.field_2._M_allocated_capacity = *psVar18;
                  local_138.field_2._8_8_ = plVar19[3];
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                }
                else {
                  local_138.field_2._M_allocated_capacity = *psVar18;
                }
                local_138._M_string_length = plVar19[1];
                *plVar19 = (long)psVar18;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                std::__cxx11::to_string(&local_c0,sVar30);
                std::operator+(&__str,&local_138,&local_c0);
                std::logic_error::logic_error(plVar20,(string *)&__str);
                __cxa_throw(plVar20,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x2870dd,(void *)0x1,(size_t)psVar23);
          }
          else {
            psVar23 = (string *)(ulong)max_id_00;
            writeXRefTable(this,t_lin_first,objid,max_id_00,size,
                           (qpdf_offset_t)((long)&(local_2d0->_M_dataplus)._M_p + sVar30),
                           iVar21 == 1,hint_id,hint_offset,(qpdf_offset_t)local_2d0,iVar21);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x2872da,(void *)0x12,(size_t)psVar23);
          }
          peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          pQVar35 = *(pointer *)
                     ((long)&(peVar3->object_queue).
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data + 8);
          for (this_02 = (peVar3->object_queue).
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start; this_02 != pQVar35;
              this_02 = this_02 + 1) {
            iVar11 = QPDFObjectHandle::getObjectID(this_02);
            if (iVar11 == iVar10) {
              pCVar5 = ((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline;
              psVar23 = pCVar5->str;
              psVar18 = (size_type *)&pCVar5->count;
              if (psVar23 != (string *)0x0) {
                psVar18 = &psVar23->_M_string_length;
              }
              local_2a0 = *psVar18;
            }
            local_1e8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (this_02->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_1e8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (this_02->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_1e8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              psVar23 = (string *)&__libc_single_threaded;
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1e8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_1e8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1e8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_1e8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            writeObject(this,&local_1e8,-1);
            if (local_1e8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1e8.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            iVar11 = QPDFObjectHandle::getObjectID(this_02);
            if (iVar11 == iVar9) {
              if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->encrypted == true) {
                writeEncryptionDictionary(this);
              }
              if (iVar21 == 1) {
                peVar3 = (this->m).
                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                lVar24 = *(long *)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                   super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                   .
                                   super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                   ._M_impl;
                psVar23 = peVar3->pipeline->str;
                psVar18 = (size_type *)&peVar3->pipeline->count;
                if (psVar23 != (string *)0x0) {
                  psVar18 = &psVar23->_M_string_length;
                }
                sVar30 = *psVar18;
                psVar23 = (string *)
                          ((long)*(pointer *)
                                  ((long)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                          super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                          .
                                          super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                  + 8) - lVar24 >> 5);
                if (idx < psVar23) {
                  psVar23 = (string *)((long)idx * 0x20);
                  pNVar16 = (NewObject *)((long)&(psVar23->_M_dataplus)._M_p + lVar24);
                }
                else {
                  pNVar16 = ObjTable<QPDFWriter::NewObject>::large_element
                                      (&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                       (size_t)idx);
                }
                (pNVar16->xref).type = 1;
                (pNVar16->xref).field1 = sVar30;
                (pNVar16->xref).field2 = 0;
              }
              else {
                ::qpdf::pl::Count::write
                          (((this->m).
                            super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->pipeline,(int)hint_buffer._M_dataplus._M_p,
                           (void *)hint_buffer._M_string_length,(size_t)psVar23);
              }
            }
            iVar11 = QPDFObjectHandle::getObjectID(this_02);
            if (iVar11 == iVar10) {
              pCVar5 = ((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline;
              psVar23 = pCVar5->str;
              psVar18 = (size_type *)&pCVar5->count;
              if (psVar23 != (string *)0x0) {
                psVar18 = &psVar23->_M_string_length;
              }
              local_268 = *psVar18;
            }
          }
          pCVar5 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pipeline;
          psVar23 = pCVar5->str;
          psVar18 = (size_type *)&pCVar5->count;
          if (psVar23 != (string *)0x0) {
            psVar18 = &psVar23->_M_string_length;
          }
          sVar30 = *psVar18;
          if (bVar2 == false) {
            local_2a8 = writeXRefStream(this,local_280,max_id,sVar30,t_lin_second,0,max_id,objid,0,0
                                        ,0,0,iVar21 == 1,iVar21);
            pCVar5 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline;
            psVar23 = pCVar5->str;
            psVar18 = (size_type *)&pCVar5->count;
            if (psVar23 != (string *)0x0) {
              psVar18 = &psVar23->_M_string_length;
            }
            if (iVar21 == 1) {
              lVar36 = *psVar18 - sVar30;
              lVar24 = lVar36 + 0x7ffe;
              if (-1 < lVar36 + 0x3fff) {
                lVar24 = lVar36 + 0x3fff;
              }
              __n = lVar24 >> 0xe;
              sVar38 = __n * 5 + 0x10;
              if (lVar36 < -0x13ffe) {
                QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar38);
              }
              writePad(this,sVar38);
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,0x2870dd,(void *)0x1,__n);
              pCVar5 = ((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline;
              psVar23 = pCVar5->str;
              psVar18 = (size_type *)&pCVar5->count;
              if (psVar23 != (string *)0x0) {
                psVar18 = &psVar23->_M_string_length;
              }
              local_270 = *psVar18;
            }
            else {
              puVar1 = (undefined *)((long)&(local_2d0->_M_dataplus)._M_p + local_270);
              nspaces = puVar1 + ~*psVar18;
              psVar23 = local_2d0;
              if ((long)nspaces < 0) {
                QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error((longlong)nspaces)
                ;
              }
              writePad(this,(size_t)nspaces);
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,0x2870dd,(void *)0x1,(size_t)psVar23);
              pCVar5 = ((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline;
              psVar23 = pCVar5->str;
              psVar18 = (size_type *)&pCVar5->count;
              if (psVar23 != (string *)0x0) {
                psVar18 = &psVar23->_M_string_length;
              }
              if ((undefined *)*psVar18 != puVar1) {
                plVar20 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error
                          (plVar20,
                           "count mismatch after xref stream; possible insufficient padding?");
                __cxa_throw(plVar20,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
            }
          }
          else {
            psVar23 = (string *)(ulong)max_id;
            local_2a8 = writeXRefTable(this,t_lin_second,0,max_id,objid,0,false,0,0,0,iVar21);
          }
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x28732e,(void *)0xa,(size_t)psVar23);
          psVar17 = (string *)-(long)psVar22;
          if (0 < (long)psVar22) {
            psVar17 = psVar22;
          }
          uVar28 = 1;
          if ((string *)0x9 < psVar17) {
            psVar23 = psVar17;
            uVar32 = 4;
            do {
              uVar28 = uVar32;
              if (psVar23 < (string *)0x64) {
                uVar28 = uVar28 - 2;
                goto LAB_001fba6c;
              }
              if (psVar23 < (string *)0x3e8) {
                uVar28 = uVar28 - 1;
                goto LAB_001fba6c;
              }
              if (psVar23 < (string *)0x2710) goto LAB_001fba6c;
              psVar26 = (string *)((ulong)psVar23 / 10000);
              bVar39 = (string *)0x1869f < psVar23;
              psVar23 = psVar26;
              uVar32 = uVar28 + 4;
            } while (bVar39);
            uVar28 = uVar28 + 1;
          }
LAB_001fba6c:
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&__str,(char)uVar28 - (char)((long)psVar22 >> 0x3f));
          std::__detail::__to_chars_10_impl<unsigned_long_long>
                    (__str._M_dataplus._M_p + -((long)psVar22 >> 0x3f),uVar28,
                     (unsigned_long_long)psVar17);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                     (size_t)psVar23);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x2872e5,(void *)0x7,(size_t)psVar23);
          if (iVar21 == 1) {
            if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->deterministic_id == true) {
              computeDeterministicIDData(this);
              _Var7 = pp_md5;
              pp_md5._M_t.
              super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
              ._M_t.
              super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
              .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
                   (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
                    )(__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                      )0x0;
              if ((__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                   )_Var7._M_t.
                    super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                    .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                   )0x0) {
                PipelinePopper::~PipelinePopper
                          ((PipelinePopper *)
                           _Var7._M_t.
                           super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                           .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl)
                ;
                operator_delete((void *)_Var7._M_t.
                                        super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                        .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                                        _M_head_impl,0x10);
              }
              if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->md5_pipeline != (Pl_MD5 *)0x0) {
                __assert_fail("m->md5_pipeline == nullptr",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                              ,0xb57,"void QPDFWriter::writeLinearized()");
              }
            }
            _Var7._M_t.
            super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
            ._M_t.
            super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
            .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
                 pp_pass1._M_t.
                 super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                 .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl;
            pCVar5 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline;
            psVar22 = pCVar5->str;
            psVar18 = (size_type *)&pCVar5->count;
            if (psVar22 != (string *)0x0) {
              psVar18 = &psVar22->_M_string_length;
            }
            local_250 = *psVar18;
            pp_pass1._M_t.
            super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
            ._M_t.
            super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
            .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
                 (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
                  )(__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                    )0x0;
            if ((__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                 )_Var7._M_t.
                  super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                  .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                 )0x0) {
              PipelinePopper::~PipelinePopper
                        ((PipelinePopper *)
                         _Var7._M_t.
                         super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                         .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl);
              operator_delete((void *)_Var7._M_t.
                                      super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                      .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                                      _M_head_impl,0x10);
            }
            peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            lVar24 = *(long *)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                               super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               .
                               super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               ._M_impl;
            if (idx < (string *)
                      ((long)*(pointer *)
                              ((long)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                      super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                      .
                                      super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                              + 8) - lVar24 >> 5)) {
              pNVar16 = (NewObject *)(lVar24 + (long)idx * 0x20);
            }
            else {
              pNVar16 = ObjTable<QPDFWriter::NewObject>::large_element
                                  (&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                   (size_t)idx);
            }
            uVar33 = QPDFXRefEntry::getOffset(&pNVar16->xref);
            __str._M_string_length = 0;
            __str._M_dataplus._M_p = (pointer)this;
            activatePipelineStack(this,(PipelinePopper *)&__str,&hint_buffer);
            writeHintStream(this,hint_id);
            PipelinePopper::~PipelinePopper((PipelinePopper *)&__str);
            sVar6 = hint_buffer._M_string_length;
            local_2d0 = (string *)hint_buffer._M_string_length;
            if ((long)hint_buffer._M_string_length < 0) {
              QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error
                        (hint_buffer._M_string_length);
            }
            peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            lVar24 = *(long *)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                               super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               .
                               super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               ._M_impl;
            if (idx < (string *)
                      ((long)*(pointer *)
                              ((long)&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                      super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                      .
                                      super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                              + 8) - lVar24 >> 5)) {
              pNVar16 = (NewObject *)(lVar24 + (long)idx * 0x20);
            }
            else {
              pNVar16 = ObjTable<QPDFWriter::NewObject>::large_element
                                  (&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                   (size_t)idx);
            }
            (pNVar16->xref).type = 1;
            (pNVar16->xref).field1 = uVar33;
            (pNVar16->xref).field2 = 0;
            if (local_2c8 == (FILE *)0x0) {
              local_2c8 = (FILE *)0x0;
            }
            else {
              uVar27 = -uVar33;
              if (0 < (long)uVar33) {
                uVar27 = uVar33;
              }
              uVar28 = 1;
              if (9 < uVar27) {
                uVar25 = uVar27;
                uVar32 = 4;
                do {
                  uVar28 = uVar32;
                  if (uVar25 < 100) {
                    uVar28 = uVar28 - 2;
                    goto LAB_001fbcfd;
                  }
                  if (uVar25 < 1000) {
                    uVar28 = uVar28 - 1;
                    goto LAB_001fbcfd;
                  }
                  if (uVar25 < 10000) goto LAB_001fbcfd;
                  bVar39 = 99999 < uVar25;
                  uVar25 = uVar25 / 10000;
                  uVar32 = uVar28 + 4;
                } while (bVar39);
                uVar28 = uVar28 + 1;
              }
LAB_001fbcfd:
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar28 - (char)((long)uVar33 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        (__str._M_dataplus._M_p + -((long)uVar33 >> 0x3f),uVar28,uVar27);
              fprintf(local_2c8,"%% hint_offset=%s\n",__str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              uVar33 = -sVar6;
              if (0 < (long)sVar6) {
                uVar33 = sVar6;
              }
              uVar28 = 1;
              if (9 < uVar33) {
                uVar27 = uVar33;
                uVar32 = 4;
                do {
                  uVar28 = uVar32;
                  if (uVar27 < 100) {
                    uVar28 = uVar28 - 2;
                    goto LAB_001fbdc9;
                  }
                  if (uVar27 < 1000) {
                    uVar28 = uVar28 - 1;
                    goto LAB_001fbdc9;
                  }
                  if (uVar27 < 10000) goto LAB_001fbdc9;
                  bVar39 = 99999 < uVar27;
                  uVar27 = uVar27 / 10000;
                  uVar32 = uVar28 + 4;
                } while (bVar39);
                uVar28 = uVar28 + 1;
              }
LAB_001fbdc9:
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar28 - (char)((long)sVar6 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        (__str._M_dataplus._M_p + -((long)sVar6 >> 0x3f),uVar28,uVar33);
              fprintf(local_2c8,"%% hint_length=%s\n",__str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              uVar33 = -sVar30;
              if (0 < (long)sVar30) {
                uVar33 = sVar30;
              }
              uVar28 = 1;
              if (9 < uVar33) {
                uVar27 = uVar33;
                uVar32 = 4;
                do {
                  uVar28 = uVar32;
                  if (uVar27 < 100) {
                    uVar28 = uVar28 - 2;
                    goto LAB_001fbe9a;
                  }
                  if (uVar27 < 1000) {
                    uVar28 = uVar28 - 1;
                    goto LAB_001fbe9a;
                  }
                  if (uVar27 < 10000) goto LAB_001fbe9a;
                  bVar39 = 99999 < uVar27;
                  uVar27 = uVar27 / 10000;
                  uVar32 = uVar28 + 4;
                } while (bVar39);
                uVar28 = uVar28 + 1;
              }
LAB_001fbe9a:
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar28 - (char)((long)sVar30 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        (__str._M_dataplus._M_p + -((long)sVar30 >> 0x3f),uVar28,uVar33);
              fprintf(local_2c8,"%% second_xref_offset=%s\n",__str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              uVar33 = -local_270;
              if (0 < (long)local_270) {
                uVar33 = local_270;
              }
              uVar28 = 1;
              if (9 < uVar33) {
                uVar27 = uVar33;
                uVar32 = 4;
                do {
                  uVar28 = uVar32;
                  if (uVar27 < 100) {
                    uVar28 = uVar28 - 2;
                    goto LAB_001fbf69;
                  }
                  if (uVar27 < 1000) {
                    uVar28 = uVar28 - 1;
                    goto LAB_001fbf69;
                  }
                  if (uVar27 < 10000) goto LAB_001fbf69;
                  bVar39 = 99999 < uVar27;
                  uVar27 = uVar27 / 10000;
                  uVar32 = uVar28 + 4;
                } while (bVar39);
                uVar28 = uVar28 + 1;
              }
LAB_001fbf69:
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar28 - (char)((long)local_270 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        (__str._M_dataplus._M_p + -((long)local_270 >> 0x3f),uVar28,uVar33);
              fprintf(local_2c8,"%% second_xref_end=%s\n",__str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              fclose(local_2c8);
              local_2c8 = (FILE *)0x0;
            }
          }
          lVar29 = lVar29 + 4;
          if (lVar29 == 8) {
            std::
            unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
            ::~unique_ptr(&pp_md5);
            std::
            unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
            ::~unique_ptr(&pp_pass1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)hint_buffer._M_dataplus._M_p != &hint_buffer.field_2) {
              operator_delete(hint_buffer._M_dataplus._M_p,
                              CONCAT71(hint_buffer.field_2._M_allocated_capacity._1_7_,
                                       hint_buffer.field_2._M_local_buf[0]) + 1);
            }
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part9);
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part8);
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part7);
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part6);
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part4);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree(&stream_cache._M_t);
            return;
          }
        } while( true );
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"error encountered after writing part 9 of linearized data");
    }
    else {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"error encountered after writing part 6 of linearized data");
    }
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"error encountered after writing part 4 of linearized data");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFWriter::writeLinearized()
{
    // Optimize file and enqueue objects in order

    std::map<int, int> stream_cache;

    auto skip_stream_parameters = [this, &stream_cache](QPDFObjectHandle& stream) {
        auto& result = stream_cache[stream.getObjectID()];
        if (result == 0) {
            bool compress_stream;
            bool is_metadata;
            if (willFilterStream(stream, compress_stream, is_metadata, nullptr)) {
                result = 2;
            } else {
                result = 1;
            }
        }
        return result;
    };

    QPDF::Writer::optimize(m->pdf, m->obj, skip_stream_parameters);

    std::vector<QPDFObjectHandle> part4;
    std::vector<QPDFObjectHandle> part6;
    std::vector<QPDFObjectHandle> part7;
    std::vector<QPDFObjectHandle> part8;
    std::vector<QPDFObjectHandle> part9;
    QPDF::Writer::getLinearizedParts(m->pdf, m->obj, part4, part6, part7, part8, part9);

    // Object number sequence:
    //
    //  second half
    //    second half uncompressed objects
    //    second half xref stream, if any
    //    second half compressed objects
    //  first half
    //    linearization dictionary
    //    first half xref stream, if any
    //    part 4 uncompresesd objects
    //    encryption dictionary, if any
    //    hint stream
    //    part 6 uncompressed objects
    //    first half compressed objects
    //

    // Second half objects
    int second_half_uncompressed = QIntC::to_int(part7.size() + part8.size() + part9.size());
    int second_half_first_obj = 1;
    int after_second_half = 1 + second_half_uncompressed;
    m->next_objid = after_second_half;
    int second_half_xref = 0;
    bool need_xref_stream = !m->obj.streams_empty;
    if (need_xref_stream) {
        second_half_xref = m->next_objid++;
    }
    // Assign numbers to all compressed objects in the second half.
    std::vector<QPDFObjectHandle>* vecs2[] = {&part7, &part8, &part9};
    for (int i = 0; i < 3; ++i) {
        for (auto const& oh: *vecs2[i]) {
            assignCompressedObjectNumbers(oh.getObjGen());
        }
    }
    int second_half_end = m->next_objid - 1;
    int second_trailer_size = m->next_objid;

    // First half objects
    int first_half_start = m->next_objid;
    int lindict_id = m->next_objid++;
    int first_half_xref = 0;
    if (need_xref_stream) {
        first_half_xref = m->next_objid++;
    }
    int part4_first_obj = m->next_objid;
    m->next_objid += QIntC::to_int(part4.size());
    int after_part4 = m->next_objid;
    if (m->encrypted) {
        m->encryption_dict_objid = m->next_objid++;
    }
    int hint_id = m->next_objid++;
    int part6_first_obj = m->next_objid;
    m->next_objid += QIntC::to_int(part6.size());
    int after_part6 = m->next_objid;
    // Assign numbers to all compressed objects in the first half
    std::vector<QPDFObjectHandle>* vecs1[] = {&part4, &part6};
    for (int i = 0; i < 2; ++i) {
        for (auto const& oh: *vecs1[i]) {
            assignCompressedObjectNumbers(oh.getObjGen());
        }
    }
    int first_half_end = m->next_objid - 1;
    int first_trailer_size = m->next_objid;

    int part4_end_marker = part4.back().getObjectID();
    int part6_end_marker = part6.back().getObjectID();
    qpdf_offset_t space_before_zero = 0;
    qpdf_offset_t file_size = 0;
    qpdf_offset_t part6_end_offset = 0;
    qpdf_offset_t first_half_max_obj_offset = 0;
    qpdf_offset_t second_xref_offset = 0;
    qpdf_offset_t first_xref_end = 0;
    qpdf_offset_t second_xref_end = 0;

    m->next_objid = part4_first_obj;
    enqueuePart(part4);
    if (m->next_objid != after_part4) {
        // This can happen with very botched files as in the fuzzer test. There are likely some
        // faulty assumptions in calculateLinearizationData
        throw std::runtime_error("error encountered after writing part 4 of linearized data");
    }
    m->next_objid = part6_first_obj;
    enqueuePart(part6);
    if (m->next_objid != after_part6) {
        throw std::runtime_error("error encountered after writing part 6 of linearized data");
    }
    m->next_objid = second_half_first_obj;
    enqueuePart(part7);
    enqueuePart(part8);
    enqueuePart(part9);
    if (m->next_objid != after_second_half) {
        throw std::runtime_error("error encountered after writing part 9 of linearized data");
    }

    qpdf_offset_t hint_length = 0;
    std::string hint_buffer;

    // Write file in two passes.  Part numbers refer to PDF spec 1.4.

    FILE* lin_pass1_file = nullptr;
    auto pp_pass1 = std::make_unique<PipelinePopper>(this);
    auto pp_md5 = std::make_unique<PipelinePopper>(this);
    for (int pass: {1, 2}) {
        if (pass == 1) {
            if (!m->lin_pass1_filename.empty()) {
                lin_pass1_file = QUtil::safe_fopen(m->lin_pass1_filename.c_str(), "wb");
                pushPipeline(new Pl_StdioFile("linearization pass1", lin_pass1_file));
                activatePipelineStack(*pp_pass1);
            } else {
                activatePipelineStack(*pp_pass1, true);
            }
            if (m->deterministic_id) {
                pushMD5Pipeline(*pp_md5);
            }
        }

        // Part 1: header

        writeHeader();

        // Part 2: linearization parameter dictionary.  Save enough space to write real dictionary.
        // 200 characters is enough space if all numerical values in the parameter dictionary that
        // contain offsets are 20 digits long plus a few extra characters for safety.  The entire
        // linearization parameter dictionary must appear within the first 1024 characters of the
        // file.

        qpdf_offset_t pos = m->pipeline->getCount();
        openObject(lindict_id);
        writeString("<<");
        if (pass == 2) {
            std::vector<QPDFObjectHandle> const& pages = m->pdf.getAllPages();
            int first_page_object = m->obj[pages.at(0)].renumber;
            int npages = QIntC::to_int(pages.size());

            writeString(" /Linearized 1 /L ");
            writeString(std::to_string(file_size + hint_length));
            // Implementation note 121 states that a space is mandatory after this open bracket.
            writeString(" /H [ ");
            writeString(std::to_string(m->new_obj[hint_id].xref.getOffset()));
            writeString(" ");
            writeString(std::to_string(hint_length));
            writeString(" ] /O ");
            writeString(std::to_string(first_page_object));
            writeString(" /E ");
            writeString(std::to_string(part6_end_offset + hint_length));
            writeString(" /N ");
            writeString(std::to_string(npages));
            writeString(" /T ");
            writeString(std::to_string(space_before_zero + hint_length));
        }
        writeString(" >>");
        closeObject(lindict_id);
        static int const pad = 200;
        writePad(QIntC::to_size(pos - m->pipeline->getCount() + pad));
        writeString("\n");

        // If the user supplied any additional header text, write it here after the linearization
        // parameter dictionary.
        writeString(m->extra_header_text);

        // Part 3: first page cross reference table and trailer.

        qpdf_offset_t first_xref_offset = m->pipeline->getCount();
        qpdf_offset_t hint_offset = 0;
        if (pass == 2) {
            hint_offset = m->new_obj[hint_id].xref.getOffset();
        }
        if (need_xref_stream) {
            // Must pad here too.
            if (pass == 1) {
                // Set first_half_max_obj_offset to a value large enough to force four bytes to be
                // reserved for each file offset.  This would provide adequate space for the xref
                // stream as long as the last object in page 1 starts with in the first 4 GB of the
                // file, which is extremely likely.  In the second pass, we will know the actual
                // value for this, but it's okay if it's smaller.
                first_half_max_obj_offset = 1 << 25;
            }
            pos = m->pipeline->getCount();
            writeXRefStream(
                first_half_xref,
                first_half_end,
                first_half_max_obj_offset,
                t_lin_first,
                first_half_start,
                first_half_end,
                first_trailer_size,
                hint_length + second_xref_offset,
                hint_id,
                hint_offset,
                hint_length,
                (pass == 1),
                pass);
            qpdf_offset_t endpos = m->pipeline->getCount();
            if (pass == 1) {
                // Pad so we have enough room for the real xref stream.
                writePad(calculateXrefStreamPadding(endpos - pos));
                first_xref_end = m->pipeline->getCount();
            } else {
                // Pad so that the next object starts at the same place as in pass 1.
                writePad(QIntC::to_size(first_xref_end - endpos));

                if (m->pipeline->getCount() != first_xref_end) {
                    throw std::logic_error(
                        "insufficient padding for first pass xref stream; "
                        "first_xref_end=" +
                        std::to_string(first_xref_end) + "; endpos=" + std::to_string(endpos));
                }
            }
            writeString("\n");
        } else {
            writeXRefTable(
                t_lin_first,
                first_half_start,
                first_half_end,
                first_trailer_size,
                hint_length + second_xref_offset,
                (pass == 1),
                hint_id,
                hint_offset,
                hint_length,
                pass);
            writeString("startxref\n0\n%%EOF\n");
        }

        // Parts 4 through 9

        for (auto const& cur_object: m->object_queue) {
            if (cur_object.getObjectID() == part6_end_marker) {
                first_half_max_obj_offset = m->pipeline->getCount();
            }
            writeObject(cur_object);
            if (cur_object.getObjectID() == part4_end_marker) {
                if (m->encrypted) {
                    writeEncryptionDictionary();
                }
                if (pass == 1) {
                    m->new_obj[hint_id].xref = QPDFXRefEntry(m->pipeline->getCount());
                } else {
                    // Part 5: hint stream
                    writeString(hint_buffer);
                }
            }
            if (cur_object.getObjectID() == part6_end_marker) {
                part6_end_offset = m->pipeline->getCount();
            }
        }

        // Part 10: overflow hint stream -- not used

        // Part 11: main cross reference table and trailer

        second_xref_offset = m->pipeline->getCount();
        if (need_xref_stream) {
            pos = m->pipeline->getCount();
            space_before_zero = writeXRefStream(
                second_half_xref,
                second_half_end,
                second_xref_offset,
                t_lin_second,
                0,
                second_half_end,
                second_trailer_size,
                0,
                0,
                0,
                0,
                (pass == 1),
                pass);
            qpdf_offset_t endpos = m->pipeline->getCount();

            if (pass == 1) {
                // Pad so we have enough room for the real xref stream.  See comments for previous
                // xref stream on how we calculate the padding.
                writePad(calculateXrefStreamPadding(endpos - pos));
                writeString("\n");
                second_xref_end = m->pipeline->getCount();
            } else {
                // Make the file size the same.
                writePad(
                    QIntC::to_size(second_xref_end + hint_length - 1 - m->pipeline->getCount()));
                writeString("\n");

                // If this assertion fails, maybe we didn't have enough padding above.
                if (m->pipeline->getCount() != second_xref_end + hint_length) {
                    throw std::logic_error(
                        "count mismatch after xref stream; possible insufficient padding?");
                }
            }
        } else {
            space_before_zero = writeXRefTable(
                t_lin_second, 0, second_half_end, second_trailer_size, 0, false, 0, 0, 0, pass);
        }
        writeString("startxref\n");
        writeString(std::to_string(first_xref_offset));
        writeString("\n%%EOF\n");

        if (pass == 1) {
            if (m->deterministic_id) {
                QTC::TC("qpdf", "QPDFWriter linearized deterministic ID", need_xref_stream ? 0 : 1);
                computeDeterministicIDData();
                pp_md5 = nullptr;
                qpdf_assert_debug(m->md5_pipeline == nullptr);
            }

            // Close first pass pipeline
            file_size = m->pipeline->getCount();
            pp_pass1 = nullptr;

            // Save hint offset since it will be set to zero by calling openObject.
            qpdf_offset_t hint_offset1 = m->new_obj[hint_id].xref.getOffset();

            // Write hint stream to a buffer
            {
                PipelinePopper pp_hint(this);
                activatePipelineStack(pp_hint, hint_buffer);
                writeHintStream(hint_id);
            }
            hint_length = QIntC::to_offset(hint_buffer.size());

            // Restore hint offset
            m->new_obj[hint_id].xref = QPDFXRefEntry(hint_offset1);
            if (lin_pass1_file) {
                // Write some debugging information
                fprintf(
                    lin_pass1_file, "%% hint_offset=%s\n", std::to_string(hint_offset1).c_str());
                fprintf(lin_pass1_file, "%% hint_length=%s\n", std::to_string(hint_length).c_str());
                fprintf(
                    lin_pass1_file,
                    "%% second_xref_offset=%s\n",
                    std::to_string(second_xref_offset).c_str());
                fprintf(
                    lin_pass1_file,
                    "%% second_xref_end=%s\n",
                    std::to_string(second_xref_end).c_str());
                fclose(lin_pass1_file);
                lin_pass1_file = nullptr;
            }
        }
    }
}